

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsFromRootToBranch(tst_GenericModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ModelTest *this_00;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  QModelIndex local_c8;
  GenericModel testModel;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QModelIndex local_68;
  QModelIndex parIndex;
  QArrayDataPointer<char16_t> local_38;
  ModelTest probe;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe;
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,5,3,
            (QModelIndex *)&local_e8,0);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x4);
  (**(code **)(_testModel + 0xf8))(&testModel,0,1,&parIndex);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  iVar4 = (int)&local_e8;
  bVar1 = (bool)GenericModel::moveRows
                          ((QModelIndex *)&testModel,iVar4,2,(QModelIndex *)0x2,(int)&parIndex);
  cVar2 = QTest::qVerify(bVar1,"testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7a0);
  if (cVar2 != '\0') {
    iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
    cVar2 = QTest::qCompare(iVar3,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7a1);
    if (cVar2 != '\0') {
      iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar3,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7a2);
      if (cVar2 != '\0') {
        local_e8._forAlignment = -NAN;
        local_e8._8_8_ = 0;
        local_e8._16_8_ = 0;
        iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar2 = QTest::qCompare(iVar3,3,"testModel.rowCount()","3",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7a3);
        if (cVar2 != '\0') {
          local_e8._forAlignment = -NAN;
          local_e8._8_8_ = 0;
          local_e8._16_8_ = 0;
          iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar2 = QTest::qCompare(iVar3,3,"testModel.columnCount()","3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7a4);
          if (cVar2 != '\0') {
            GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x1);
            QModelIndex::data((QVariant *)&local_e8,&local_68,0);
            QVariant::toString();
            local_80.d = (Data *)0x0;
            local_80.ptr = L"2,0";
            local_80.size = 3;
            local_98.d = (Data *)0x0;
            local_98.ptr = (char16_t *)0x0;
            local_98.size = 0;
            bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_80,
                                    "testModel.index(1, 0, parIndex).data().toString()",
                                    "QStringLiteral(\"2,0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7a6);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_c8);
            QVariant::~QVariant((QVariant *)&local_e8);
            if (bVar1) {
              GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x2);
              QModelIndex::data((QVariant *)&local_e8,&local_68,0);
              QVariant::toString();
              local_80.d = (Data *)0x0;
              local_80.ptr = L"3,0";
              local_80.size = 3;
              local_98.d = (Data *)0x0;
              local_98.ptr = (char16_t *)0x0;
              local_98.size = 0;
              bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_80,
                                      "testModel.index(2, 0, parIndex).data().toString()",
                                      "QStringLiteral(\"3,0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7a7);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_c8);
              QVariant::~QVariant((QVariant *)&local_e8);
              if (bVar1) {
                GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x1);
                QModelIndex::data((QVariant *)&local_e8,&local_68,0);
                QVariant::toString();
                local_80.d = (Data *)0x0;
                local_80.ptr = L"2,2";
                local_80.size = 3;
                local_98.d = (Data *)0x0;
                local_98.ptr = (char16_t *)0x0;
                local_98.size = 0;
                bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_80,
                                        "testModel.index(1, 2, parIndex).data().toString()",
                                        "QStringLiteral(\"2,2\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7a8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_c8);
                QVariant::~QVariant((QVariant *)&local_e8);
                if (bVar1) {
                  GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x2);
                  QModelIndex::data((QVariant *)&local_e8,&local_68,0);
                  QVariant::toString();
                  local_80.d = (Data *)0x0;
                  local_80.ptr = L"3,2";
                  local_80.size = 3;
                  local_98.d = (Data *)0x0;
                  local_98.ptr = (char16_t *)0x0;
                  local_98.size = 0;
                  bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_80,
                                          "testModel.index(2, 2, parIndex).data().toString()",
                                          "QStringLiteral(\"3,2\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7a9);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_c8);
                  QVariant::~QVariant((QVariant *)&local_e8);
                  if (bVar1) {
                    GenericModel::index(iVar4,(int)&testModel,(QModelIndex *)0x1);
                    bVar1 = false;
                    if ((-1 < (int)local_e8._0_4_) && (bVar1 = false, -1 < (long)local_e8.shared)) {
                      bVar1 = local_e8._16_8_ != 0;
                    }
                    cVar2 = QTest::qVerify(bVar1,"testModel.index(1, 3, parIndex).isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x7aa);
                    if (cVar2 != '\0') {
                      GenericModel::index(iVar4,(int)&testModel,(QModelIndex *)0x2);
                      bVar1 = false;
                      if ((-1 < (int)local_e8._0_4_) && (bVar1 = false, -1 < (long)local_e8.shared))
                      {
                        bVar1 = local_e8._16_8_ != 0;
                      }
                      cVar2 = QTest::qVerify(bVar1,"testModel.index(2, 3, parIndex).isValid()","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x7ab);
                      if (cVar2 != '\0') {
                        GenericModel::index((int)&local_c8,(int)&testModel,(QModelIndex *)0x1);
                        QModelIndex::data((QVariant *)&local_e8,&local_c8,0);
                        bVar1 = QVariant::isValid((QVariant *)&local_e8);
                        cVar2 = QTest::qVerify(!bVar1,
                                               "!testModel.index(1, 3, parIndex).data().isValid()",
                                               "",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x7ac);
                        QVariant::~QVariant((QVariant *)&local_e8);
                        if (cVar2 != '\0') {
                          GenericModel::index((int)&local_c8,(int)&testModel,(QModelIndex *)0x2);
                          QModelIndex::data((QVariant *)&local_e8,&local_c8,0);
                          bVar1 = QVariant::isValid((QVariant *)&local_e8);
                          cVar2 = QTest::qVerify(!bVar1,
                                                 "!testModel.index(2, 3, parIndex).data().isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x7ad);
                          QVariant::~QVariant((QVariant *)&local_e8);
                          if (cVar2 != '\0') {
                            local_80.d = (Data *)0xffffffffffffffff;
                            local_80.ptr = (char16_t *)0x0;
                            local_80.size = 0;
                            GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x0);
                            QModelIndex::data((QVariant *)&local_e8,&local_68,0);
                            QVariant::toString();
                            local_98.d = (Data *)0x0;
                            local_98.ptr = L"0,0";
                            local_98.size = 3;
                            local_38.d = (Data *)0x0;
                            local_38.ptr = (char16_t *)0x0;
                            local_38.size = 0;
                            bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_98,
                                                    "testModel.index(0, 0).data().toString()",
                                                    "QStringLiteral(\"0,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7ae);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)&local_c8);
                            QVariant::~QVariant((QVariant *)&local_e8);
                            if (bVar1) {
                              local_80.d = (Data *)0xffffffffffffffff;
                              local_80.ptr = (char16_t *)0x0;
                              local_80.size = 0;
                              GenericModel::index((int)&local_68,(int)&testModel,(QModelIndex *)0x1)
                              ;
                              QModelIndex::data((QVariant *)&local_e8,&local_68,0);
                              QVariant::toString();
                              local_98.d = (Data *)0x0;
                              local_98.ptr = L"1,0";
                              local_98.size = 3;
                              local_38.d = (Data *)0x0;
                              local_38.ptr = (char16_t *)0x0;
                              local_38.size = 0;
                              bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_98,
                                                      "testModel.index(1, 0).data().toString()",
                                                      "QStringLiteral(\"1,0\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7af);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer
                                        ((QArrayDataPointer<char16_t> *)&local_c8);
                              QVariant::~QVariant((QVariant *)&local_e8);
                              if (bVar1) {
                                local_80.d = (Data *)0xffffffffffffffff;
                                local_80.ptr = (char16_t *)0x0;
                                local_80.size = 0;
                                GenericModel::index((int)&local_68,(int)&testModel,
                                                    (QModelIndex *)0x2);
                                QModelIndex::data((QVariant *)&local_e8,&local_68,0);
                                QVariant::toString();
                                local_98.d = (Data *)0x0;
                                local_98.ptr = L"4,0";
                                local_98.size = 3;
                                local_38.d = (Data *)0x0;
                                local_38.ptr = (char16_t *)0x0;
                                local_38.size = 0;
                                bVar1 = QTest::qCompare((QString *)&local_c8,(QString *)&local_98,
                                                        "testModel.index(2, 0).data().toString()",
                                                        "QStringLiteral(\"4,0\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b0);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_c8);
                                QVariant::~QVariant((QVariant *)&local_e8);
                                if (bVar1) {
                                  GenericModel::headerData(iVar4,(Orientation)&testModel,0);
                                  iVar3 = QVariant::toInt((bool *)local_e8.data);
                                  cVar2 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(0, Qt::Vertical).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b1);
                                  QVariant::~QVariant((QVariant *)&local_e8);
                                  if (cVar2 != '\0') {
                                    GenericModel::headerData(iVar4,(Orientation)&testModel,1);
                                    iVar3 = QVariant::toInt((bool *)local_e8.data);
                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(1, Qt::Vertical).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b2);
                                    QVariant::~QVariant((QVariant *)&local_e8);
                                    if (cVar2 != '\0') {
                                      GenericModel::headerData(iVar4,(Orientation)&testModel,2);
                                      iVar4 = QVariant::toInt((bool *)local_e8.data);
                                      QTest::qCompare(iVar4,4,
                                                  "testModel.headerData(2, Qt::Vertical).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b3);
                                      QVariant::~QVariant((QVariant *)&local_e8);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromRootToBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRow(0, parIndex);

    QVERIFY(testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 3);
    QCOMPARE(testModel.columnCount(), 3);

    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("2,2"));
    QCOMPARE(testModel.index(2, 2, parIndex).data().toString(), QStringLiteral("3,2"));
    QVERIFY(testModel.index(1, 3, parIndex).isValid());
    QVERIFY(testModel.index(2, 3, parIndex).isValid());
    QVERIFY(!testModel.index(1, 3, parIndex).data().isValid());
    QVERIFY(!testModel.index(2, 3, parIndex).data().isValid());
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("4,0"));
    QCOMPARE(testModel.headerData(0, Qt::Vertical).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Vertical).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Vertical).toInt(), 4);
}